

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gregorian.cpp
# Opt level: O0

string * __thiscall
booster::locale::util::gregorian_calendar::get_timezone_abi_cxx11_(gregorian_calendar *this)

{
  long in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string((string *)in_RDI,(string *)(in_RSI + 0x90));
  return in_RDI;
}

Assistant:

virtual std::string get_timezone() const
            {
                return time_zone_name_;
            }